

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

uint8_t bit_reader_read(bit_reader_t *r,uint n)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  
  uVar1 = r->current_byte_len;
  uVar5 = 0;
  uVar2 = n;
  if (uVar1 < n) {
    bVar3 = r->current_byte;
    sVar4 = r->byte_index;
    r->byte_index = sVar4 + 1;
    r->current_byte = r->bytes[sVar4 + 1];
    uVar2 = n - (int)uVar1;
    r->current_byte_len = 8;
    uVar5 = (~(-1 << ((byte)uVar1 & 0x1f)) & (uint)bVar3) << ((byte)uVar2 & 0x1f);
  }
  sVar4 = r->current_byte_len - (ulong)uVar2;
  bVar3 = (byte)sVar4;
  r->current_byte_len = sVar4;
  return reverse_table
         [((uint)r->current_byte & ~(-1 << ((byte)uVar2 & 0x1f)) << (bVar3 & 0x1f)) >>
          (bVar3 & 0x1f) | uVar5] >> (8U - (char)n & 0x1f);
}

Assistant:

uint8_t bit_reader_read(bit_reader_t *r, unsigned int n) {
    unsigned int read = 0;
    unsigned int n_copy = n;

    if (r->current_byte_len < n) {
        read = r->current_byte & ((1 << r->current_byte_len) - 1);
        r->byte_index++;
        r->current_byte = r->bytes[r->byte_index];
        n -= r->current_byte_len;
        r->current_byte_len = 8;
        read <<= n;
    }

    uint8_t copy_mask = (1 << n) - 1;
    copy_mask <<= (r->current_byte_len - n);
    read |= (r->current_byte & copy_mask) >> (r->current_byte_len - n);
    r->current_byte_len -= n;
    return reverse_table[read] >> (8 - n_copy);
}